

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O0

bool cppcms::encoding::iso_8859_6_valid<char_const*>(char *p,char *e,size_t *count)

{
  uint uVar1;
  char *pcVar2;
  uint c;
  size_t *count_local;
  char *e_local;
  char *p_local;
  
  p_local = p;
  while( true ) {
    do {
      if (p_local == e) {
        return true;
      }
      *count = *count + 1;
      pcVar2 = p_local + 1;
      uVar1 = (uint)(byte)*p_local;
      p_local = pcVar2;
    } while (((uVar1 == 9) || (uVar1 == 10)) || (uVar1 == 0xd));
    if ((uVar1 < 0x20) || ((0x7e < uVar1 && (uVar1 < 0xa0)))) break;
    if ((((((0xa0 < uVar1) && (uVar1 < 0xa4)) || ((0xa4 < uVar1 && (uVar1 < 0xac)))) ||
         ((0xad < uVar1 && (uVar1 < 0xbb)))) || ((0xbb < uVar1 && (uVar1 < 0xbf)))) ||
       (((uVar1 == 0xc0 || ((0xda < uVar1 && (uVar1 < 0xe0)))) ||
        ((0xf2 < uVar1 && (uVar1 < 0x100)))))) {
      return false;
    }
  }
  return false;
}

Assistant:

bool iso_8859_6_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || (0x7F<=c && c<0xA0))
				return false;
			if(	(0xA1<=c && c<=0xA3) ||
			 	(0xA5 <=c && c<= 0xAB) || 
				(0xAE <=c && c<= 0xBA) ||
				(0xBC <=c && c<= 0xBE) ||
				 0xC0 == c		||
				(0xDB <=c && c<= 0xDF) ||
				(0xF3 <=c && c<= 0xFF))
			{
				return false;
			}
		}
		return true;
	}